

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

void density_tests::detail::
     sp_queues_generic_tests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>
               (QueueTesterFlags i_flags,ostream *i_output,EasyRandom *i_random,
               size_t i_element_count,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *i_nonblocking_thread_counts)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *this;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_a8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  this = &_Stack_a8;
  if ((i_flags & eUseTestAllocators) == eNone) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_a8,
               i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_a8);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
               i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
               i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
    this = &local_90;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
               i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(this);
  return;
}

Assistant:

void sp_queues_generic_tests(
          QueueTesterFlags            i_flags,
          std::ostream &              i_output,
          EasyRandom &                i_random,
          size_t                      i_element_count,
          std::vector<size_t> const & i_nonblocking_thread_counts)
        {
            using namespace density;

            if (i_flags && QueueTesterFlags::eUseTestAllocators)
            {
                single_lf_queue_generic_test<sp_heter_queue<
                  runtime_type<>,
                  UnmovableFastTestAllocator<>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);

                single_lf_queue_generic_test<sp_heter_queue<
                  TestRuntimeTime<>,
                  DeepTestAllocator<>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);

                single_lf_queue_generic_test<sp_heter_queue<
                  runtime_type<>,
                  UnmovableFastTestAllocator<256>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);

                single_lf_queue_generic_test<sp_heter_queue<
                  TestRuntimeTime<>,
                  DeepTestAllocator<256>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);
            }
            else
            {
                single_lf_queue_generic_test<sp_heter_queue<
                  runtime_type<>,
                  default_allocator,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);
            }
        }